

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O1

QPDFObjectHandle __thiscall
QPDFParser::withDescription<QPDF_Real,std::__cxx11::string_const&>
          (QPDFParser *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  undefined8 uVar1;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  QPDFObjectHandle QVar4;
  shared_ptr<QPDFObject> obj;
  undefined8 local_30;
  undefined8 local_28;
  
  QPDFObject::create<QPDF_Real,std::__cxx11::string_const&>
            ((QPDFObject *)&stack0xffffffffffffffd0,in_RDX);
  uVar2 = local_30;
  uVar1 = *(undefined8 *)((long)&args[3].field_2 + 8);
  *(pointer *)(local_30 + 0x48) = args[1]._M_dataplus._M_p;
  *(size_type *)(local_30 + 0x38) = args[1]._M_string_length;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_30 + 0x40),
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&args[1].field_2._M_allocated_capacity);
  if (*(long *)(uVar2 + 0x58) < 0) {
    *(undefined8 *)(uVar2 + 0x58) = uVar1;
  }
  this->input = (InputSource *)local_30;
  this->object_description = (string *)local_28;
  if ((string *)local_28 != (string *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_28 + 8) = *(int *)(local_28 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_28 + 8) = *(int *)(local_28 + 8) + 1;
    }
  }
  _Var3._M_pi = extraout_RDX;
  if ((string *)local_28 != (string *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28);
    _Var3._M_pi = extraout_RDX_00;
  }
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFParser::withDescription(Args&&... args)
{
    auto obj = QPDFObject::create<T>(std::forward<Args>(args)...);
    obj->setDescription(context, description, start);
    return {obj};
}